

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O3

void __thiscall
wasm::CoalesceLocalsWithLearning::pickIndices
          (CoalesceLocalsWithLearning *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  pointer *this_00;
  double dVar1;
  uint uVar2;
  default_delete<Order> *pdVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  long *plVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  pointer puVar9;
  size_t sVar10;
  long lVar11;
  Order *pOVar12;
  result_type rVar13;
  ulong uVar14;
  ulong uVar15;
  Order *pOVar16;
  Order *pOVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  Order *pOVar21;
  double dVar22;
  undefined1 local_27f8 [8];
  Generator generator;
  GeneticLearner<Order,_double,_Generator> learner;
  vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  local_88;
  undefined1 auStack_68 [8];
  Index removedCopies;
  pointer local_58;
  long local_48;
  Order *local_40;
  ulong local_38;
  
  sVar10 = Function::getNumVars
                     ((this->super_CoalesceLocals).
                      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                      .
                      super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                      .
                      super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .currFunction);
  if (sVar10 < 2) {
    CoalesceLocals::pickIndices(&this->super_CoalesceLocals,indices);
    return;
  }
  sVar10 = Function::getNumVars
                     ((this->super_CoalesceLocals).
                      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                      .
                      super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                      .
                      super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .currFunction);
  uVar20 = ((int)sVar10 + -1) * (int)sVar10;
  generator.parent = (CoalesceLocalsWithLearning *)0x2a;
  uVar14 = 0x2a;
  lVar11 = 2;
  do {
    uVar14 = (ulong)((((uint)(uVar14 >> 0x1e) ^ (uint)uVar14) * 0x6c078965 + (int)lVar11) - 1);
    generator.noise._M_x[lVar11 + -2] = uVar14;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x271);
  generator._5008_8_ = local_27f8;
  generator.noise._M_x[0x26f] = 0x270;
  generator.noise._M_p._0_1_ = 1;
  learner.generator = (Generator *)0x0;
  learner.population.
  super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  learner.population.
  super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  learner.population.
  super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x539;
  uVar14 = 0x539;
  lVar11 = 5;
  do {
    uVar14 = (ulong)((((uint)(uVar14 >> 0x1e) ^ (uint)uVar14) * 0x6c078965 + (int)lVar11) - 4);
    learner.noise._M_x[lVar11 + -5] = uVar14;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x274);
  pOVar16 = (Order *)0x14;
  if (uVar20 < 0x14) {
    pOVar16 = (Order *)(ulong)uVar20;
  }
  learner.noise._M_x[0x26f] = 0x270;
  pOVar17 = pOVar16;
  local_27f8 = (undefined1  [8])this;
  std::
  vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ::resize((vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
            *)&learner,(size_type)pOVar16);
  if (uVar20 != 0) {
    pOVar21 = (Order *)0x0;
    do {
      pOVar12 = pickIndices::Generator::makeRandom((Generator *)local_27f8);
      pdVar3 = (default_delete<Order> *)
               ((learner.generator)->noise)._M_x[(long)((long)&pOVar21[-1].fitness + 7)];
      ((learner.generator)->noise)._M_x[(long)((long)&pOVar21[-1].fitness + 7)] =
           (unsigned_long)pOVar12;
      if (pdVar3 != (default_delete<Order> *)0x0) {
        std::default_delete<Order>::operator()(pdVar3,pOVar17);
      }
      pOVar21 = (Order *)((long)&(pOVar21->super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                 ).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
    } while (pOVar16 != pOVar21);
  }
  GeneticLearner<Order,_double,_Generator>::sort
            ((GeneticLearner<Order,_double,_Generator> *)learner.generator);
  dVar22 = (double)((learner.generator)->parent->super_CoalesceLocals).
                   super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                   .super_Pass.name._M_string_length;
  do {
    uVar14 = (long)learner.population.
                   super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)learner.generator >> 3;
    pOVar16 = (Order *)((uVar14 * 0x32) / 100);
    local_88.
    super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = pOVar16;
    std::
    vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ::resize(&local_88,(size_type)pOVar16);
    puVar9 = local_88.
             super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (uVar14 * 0x19) / 100;
    if (99 < uVar14 * 0x32) {
      local_48 = (long)&(local_40->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + (ulong)(local_40 == (Order *)0x0);
      lVar11 = 0;
      do {
        uVar8 = generator._5008_8_;
        this_00 = &learner.population.
                   super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        rVar13 = std::
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)this_00);
        __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              ((learner.generator)->noise)._M_x
              [rVar13 % (ulong)((long)learner.population.
                                      super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start -
                                (long)learner.generator >> 3) - 1];
        rVar13 = std::
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)this_00);
        learner.noise._M_p = uVar8;
        plVar4 = (long *)((learner.generator)->noise)._M_x
                         [rVar13 % (ulong)((long)learner.population.
                                                 super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start -
                                           (long)learner.generator >> 3) - 1];
        uVar19 = (long)(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        auStack_68 = (undefined1  [8])0x0;
        _removedCopies = (pointer)0x0;
        local_58 = (pointer)0x0;
        iVar18 = (int)uVar19;
        uVar19 = uVar19 & 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,uVar19);
        if (iVar18 != 0) {
          lVar5 = *plVar4;
          uVar15 = 0;
          do {
            *(uint *)((long)auStack_68 + (ulong)*(uint *)(lVar5 + uVar15 * 4) * 4) = (uint)uVar15;
            uVar15 = uVar15 + 1;
          } while (uVar19 != uVar15);
        }
        pOVar16 = (Order *)operator_new(0x20);
        *(undefined8 *)
         &(pOVar16->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> = 0;
        *(pointer *)
         ((long)&(pOVar16->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) = (pointer)0x0
        ;
        *(pointer *)
         ((long)&(pOVar16->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 0x10) =
             (pointer)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar16,__x);
        sVar10 = learner.noise._M_p;
        pOVar16->fitness =
             (double)__x[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        if (iVar18 == 0) {
          __assert_fail("size >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                        ,699,
                        "Order *wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<Index> &)::Generator::makeMixture(Order *, Order *)"
                       );
        }
        uVar19 = Function::getNumParams(*(Function **)(*(long *)learner.noise._M_p + 0x120));
        if ((uint)uVar19 < iVar18 - 1U) {
          lVar5 = *(long *)&(pOVar16->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
          do {
            uVar15 = uVar19 & 0xffffffff;
            uVar20 = *(uint *)(lVar5 + uVar15 * 4);
            uVar2 = *(uint *)(lVar5 + 4 + uVar15 * 4);
            if (*(uint *)((long)auStack_68 + (ulong)uVar2 * 4) <
                *(uint *)((long)auStack_68 + (ulong)uVar20 * 4)) {
              *(uint *)(lVar5 + uVar15 * 4) = uVar2;
              *(uint *)(lVar5 + (uVar15 + 1) * 4) = uVar20;
              uVar20 = (int)uVar19 + 2;
            }
            else {
              uVar20 = (int)uVar19 + 1;
            }
            uVar19 = (ulong)uVar20;
          } while (uVar20 < iVar18 - 1U);
        }
        pOVar17 = pOVar16;
        pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator::
        calculateFitness(wasm::CoalesceLocalsWithLearning::
        pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order__
                  ((void *)sVar10,pOVar16);
        if (auStack_68 != (undefined1  [8])0x0) {
          pOVar17 = (Order *)((long)local_58 - (long)auStack_68);
          operator_delete((void *)auStack_68,(ulong)pOVar17);
        }
        pOVar21 = puVar9[lVar11]._M_t.super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t
                  .super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
                  super__Head_base<0UL,_Order_*,_false>._M_head_impl;
        puVar9[lVar11]._M_t.super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
        super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
        super__Head_base<0UL,_Order_*,_false>._M_head_impl = pOVar16;
        if (pOVar21 != (Order *)0x0) {
          std::default_delete<Order>::operator()((default_delete<Order> *)pOVar21,pOVar17);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_48);
      lVar11 = 0;
      do {
        pOVar16 = (Order *)((learner.generator)->noise)._M_x[local_38 + lVar11 + -1];
        ((learner.generator)->noise)._M_x[local_38 + lVar11 + -1] =
             (unsigned_long)
             puVar9[lVar11]._M_t.super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
             super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
             super__Head_base<0UL,_Order_*,_false>._M_head_impl;
        puVar9[lVar11]._M_t.super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
        super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
        super__Head_base<0UL,_Order_*,_false>._M_head_impl = pOVar16;
        lVar11 = lVar11 + 1;
      } while (local_48 != lVar11);
    }
    for (uVar19 = (long)&(local_40->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + local_38; uVar19 < uVar14;
        uVar19 = uVar19 + 1) {
      pOVar17 = pickIndices::Generator::makeRandom((Generator *)generator._5008_8_);
      pdVar3 = (default_delete<Order> *)((learner.generator)->noise)._M_x[uVar19 - 1];
      ((learner.generator)->noise)._M_x[uVar19 - 1] = (unsigned_long)pOVar17;
      if (pdVar3 != (default_delete<Order> *)0x0) {
        std::default_delete<Order>::operator()(pdVar3,pOVar16);
      }
    }
    GeneticLearner<Order,_double,_Generator>::sort
              ((GeneticLearner<Order,_double,_Generator> *)learner.generator);
    std::
    vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ::~vector(&local_88);
    dVar1 = (double)((learner.generator)->parent->super_CoalesceLocals).
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    .super_Pass.name._M_string_length;
    bVar6 = NAN(dVar22);
    bVar7 = dVar1 == dVar22;
    dVar22 = dVar1;
    if ((bVar7) && (!NAN(dVar1) && !bVar6)) {
      CoalesceLocals::pickIndicesFromOrder
                (&this->super_CoalesceLocals,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(learner.generator)->parent,
                 indices,(Index *)auStack_68);
      std::
      vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
      ::~vector((vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                 *)&learner);
      return;
    }
  } while( true );
}

Assistant:

void CoalesceLocalsWithLearning::pickIndices(std::vector<Index>& indices) {
  if (getFunction()->getNumVars() <= 1) {
    // nothing to think about here
    CoalesceLocals::pickIndices(indices);
    return;
  }

  struct Order : public std::vector<Index> {
    void setFitness(double f) { fitness = f; }
    double getFitness() { return fitness; }
    void dump(std::string text) {
      std::cout << text + ": ( ";
      for (Index i = 0; i < size(); i++) {
        std::cout << (*this)[i] << " ";
      }
      std::cout << ")\n";
      std::cout << "of quality: " << getFitness() << "\n";
    }

  private:
    double fitness;
  };

  struct Generator {
    Generator(CoalesceLocalsWithLearning* parent) : parent(parent), noise(42) {}

    void calculateFitness(Order* order) {
      // apply the order
      std::vector<Index> indices; // the phenotype
      Index removedCopies;
      parent->pickIndicesFromOrder(*order, indices, removedCopies);
      auto maxIndex = *std::max_element(indices.begin(), indices.end());
      assert(maxIndex <= parent->numLocals);
      // main part of fitness is the number of locals
      double fitness = parent->numLocals - maxIndex; // higher fitness is better
      // secondarily, it is nice to not reorder locals unnecessarily
      double fragment = 1.0 / (2.0 * parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        if ((*order)[i] == i) {
          fitness += fragment; // boost for each that wasn't moved
        }
      }
      // removing copies is a secondary concern
      fitness = (100 * fitness) + removedCopies;
      order->setFitness(fitness);
    }

    Order* makeRandom() {
      auto* ret = new Order;
      ret->resize(parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        (*ret)[i] = i;
      }
      if (first) {
        // as the first guess, use the natural order. this is not arbitrary for
        // two reasons. first, there may be an inherent order in the input
        // (frequent indices are lower, etc.). second, by ensuring we start with
        // the natural order, we ensure we are at least as good as the
        // non-learning variant.
        // TODO: use ::pickIndices from the parent, so we literally get the
        //       simpler approach as our first option
        first = false;
      } else {
        // leave params alone, shuffle the rest
        std::shuffle(ret->begin() + parent->getFunction()->getNumParams(),
                     ret->end(),
                     noise);
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      order->dump("new rando");
#endif
      return ret;
    }

    Order* makeMixture(Order* left, Order* right) {
      // perturb left using right. this is useful since
      // we don't care about absolute locations, relative ones matter more,
      // and a true merge of two vectors could obscure that (e.g.
      // a.......... and ..........a would merge a into the middle, for no
      // reason), and cause a lot of unnecessary noise
      Index size = left->size();
      Order reverseRight; // reverseRight[x] is the index of x in right
      reverseRight.resize(size);
      for (Index i = 0; i < size; i++) {
        reverseRight[(*right)[i]] = i;
      }
      auto* ret = new Order;
      *ret = *left;
      assert(size >= 1);
      for (Index i = parent->getFunction()->getNumParams(); i < size - 1; i++) {
        // if (i, i + 1) is in reverse order in right, flip them
        if (reverseRight[(*ret)[i]] > reverseRight[(*ret)[i + 1]]) {
          std::swap((*ret)[i], (*ret)[i + 1]);
          // if we don't skip, we might end up pushing an element all the way to
          // the end, which is not very perturbation-y
          i++;
        }
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      ret->dump("new mixture");
#endif
      return ret;
    }

  private:
    CoalesceLocalsWithLearning* parent;
    std::mt19937 noise;
    bool first = true;
  };

#ifdef CFG_LEARN_DEBUG
  std::cout << "[learning for " << getFunction()->name << "]\n";
#endif
  auto numVars = this->getFunction()->getNumVars();
  const int GENERATION_SIZE =
    std::min(Index(numVars * (numVars - 1)), Index(20));
  Generator generator(this);
  GeneticLearner<Order, double, Generator> learner(generator, GENERATION_SIZE);
#ifdef CFG_LEARN_DEBUG
  learner.getBest()->dump("first best");
#endif
  // keep working while we see improvement
  auto oldBest = learner.getBest()->getFitness();
  while (1) {
    learner.runGeneration();
    auto newBest = learner.getBest()->getFitness();
    if (newBest == oldBest) {
      break; // unlikely we can improve
    }
    oldBest = newBest;
#ifdef CFG_LEARN_DEBUG
    learner.getBest()->dump("current best");
#endif
  }
#ifdef CFG_LEARN_DEBUG
  learner.getBest()->dump("the best");
#endif
  // TODO: cache indices in Orders, at the cost of more memory?
  this->pickIndicesFromOrder(*learner.getBest(), indices);
}